

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

void __thiscall
glcts::InterfaceMatchingCaseFloat::generateVarLinkVertexShaderSrc
          (InterfaceMatchingCaseFloat *this,string *outVtxSrc,GLSLVersion glslVersion,
          string *precision,TestType testMode)

{
  char *pcVar1;
  ostream *poVar2;
  ostream *poVar3;
  ostringstream vtxSrc;
  string local_1c0 [32];
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar2 = std::operator<<(&local_1a0,pcVar1);
  std::operator<<(poVar2,"\n");
  if (8 < (int)glslVersion) {
    std::operator<<(&local_1a0,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n");
  }
  std::operator<<(&local_1a0,"in highp vec4 a_position;\n");
  poVar2 = &local_1a0;
  std::operator<<(poVar2,"uniform highp vec4 u_color;\n");
  pcVar1 = "out float var;\n";
  if (testMode != DEFAULT_PRECISION) {
    if (testMode == SET_PRECISION) {
      poVar2 = std::operator<<(&local_1a0,"out ");
      poVar2 = std::operator<<(poVar2,(string *)precision);
      pcVar1 = " float var;\n";
    }
    else {
      if (testMode != SET_DEFAULT_PRECISION) goto LAB_00bfde85;
      poVar2 = &local_1a0;
      poVar3 = std::operator<<(poVar2,"precision ");
      poVar3 = std::operator<<(poVar3,(string *)precision);
      std::operator<<(poVar3," float;\n");
    }
  }
  std::operator<<(poVar2,pcVar1);
LAB_00bfde85:
  std::operator<<(&local_1a0,"void main (void)\n");
  std::operator<<(&local_1a0,"{\n");
  std::operator<<(&local_1a0,"   gl_Position = a_position;\n");
  std::operator<<(&local_1a0,"   var = u_color.r;\n");
  std::operator<<(&local_1a0,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)outVtxSrc,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return;
}

Assistant:

void generateVarLinkVertexShaderSrc(std::string& outVtxSrc, glu::GLSLVersion glslVersion, const string& precision,
										TestType testMode)
	{
		std::ostringstream vtxSrc;
		vtxSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		if (glslVersion >= glu::GLSL_VERSION_410)
		{
			vtxSrc << "out gl_PerVertex {\n"
					  "  vec4 gl_Position;\n"
					  "};\n";
		}
		vtxSrc << "in highp vec4 a_position;\n";
		vtxSrc << "uniform highp vec4 u_color;\n";
		switch (testMode)
		{
		case SET_DEFAULT_PRECISION:
			vtxSrc << "precision " << precision << " float;\n";
		case DEFAULT_PRECISION:
			vtxSrc << "out float var;\n";
			break;
		case SET_PRECISION:
			vtxSrc << "out " << precision << " float var;\n";
			break;
		}
		vtxSrc << "void main (void)\n";
		vtxSrc << "{\n";
		vtxSrc << "   gl_Position = a_position;\n";
		vtxSrc << "   var = u_color.r;\n";
		vtxSrc << "}\n";
		outVtxSrc = vtxSrc.str();
	}